

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

GLenum toGlBlendFactor(BlendFactor f)

{
  uint in_EDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  GLenum in_stack_ffffffffffffffd4;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch((char *)(ulong)in_EDI) {
  case (char *)0x0:
    in_stack_ffffffffffffffd4 = 0;
    break;
  case (char *)0x1:
    in_stack_ffffffffffffffd4 = 1;
    break;
  case (char *)0x2:
    in_stack_ffffffffffffffd4 = 0x300;
    break;
  case (char *)0x3:
    in_stack_ffffffffffffffd4 = 0x301;
    break;
  case (char *)0x4:
    in_stack_ffffffffffffffd4 = 0x306;
    break;
  case (char *)0x5:
    in_stack_ffffffffffffffd4 = 0x307;
    break;
  case (char *)0x6:
    in_stack_ffffffffffffffd4 = 0x302;
    break;
  case (char *)0x7:
    in_stack_ffffffffffffffd4 = 0x303;
    break;
  case (char *)0x8:
    in_stack_ffffffffffffffd4 = 0x304;
    break;
  case (char *)0x9:
    in_stack_ffffffffffffffd4 = 0x305;
    break;
  case (char *)0xa:
    in_stack_ffffffffffffffd4 = 0x8001;
    break;
  case (char *)0xb:
    in_stack_ffffffffffffffd4 = 0x8002;
    break;
  case (char *)0xc:
    in_stack_ffffffffffffffd4 = 0x8003;
    break;
  case (char *)0xd:
    in_stack_ffffffffffffffd4 = 0x8004;
    break;
  case (char *)0xe:
    in_stack_ffffffffffffffd4 = 0x308;
    break;
  case (char *)0xf:
  case (char *)0x10:
  case (char *)0x11:
  case (char *)0x12:
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffffd4,in_EDI),(char *)(ulong)in_EDI,
               in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
    QMessageLogger::warning(local_28,"Unsupported blend factor %d",(ulong)in_EDI);
    in_stack_ffffffffffffffd4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_stack_ffffffffffffffd4;
}

Assistant:

static inline GLenum toGlBlendFactor(QRhiGraphicsPipeline::BlendFactor f)
{
    switch (f) {
    case QRhiGraphicsPipeline::Zero:
        return GL_ZERO;
    case QRhiGraphicsPipeline::One:
        return GL_ONE;
    case QRhiGraphicsPipeline::SrcColor:
        return GL_SRC_COLOR;
    case QRhiGraphicsPipeline::OneMinusSrcColor:
        return GL_ONE_MINUS_SRC_COLOR;
    case QRhiGraphicsPipeline::DstColor:
        return GL_DST_COLOR;
    case QRhiGraphicsPipeline::OneMinusDstColor:
        return GL_ONE_MINUS_DST_COLOR;
    case QRhiGraphicsPipeline::SrcAlpha:
        return GL_SRC_ALPHA;
    case QRhiGraphicsPipeline::OneMinusSrcAlpha:
        return GL_ONE_MINUS_SRC_ALPHA;
    case QRhiGraphicsPipeline::DstAlpha:
        return GL_DST_ALPHA;
    case QRhiGraphicsPipeline::OneMinusDstAlpha:
        return GL_ONE_MINUS_DST_ALPHA;
    case QRhiGraphicsPipeline::ConstantColor:
        return GL_CONSTANT_COLOR;
    case QRhiGraphicsPipeline::OneMinusConstantColor:
        return GL_ONE_MINUS_CONSTANT_COLOR;
    case QRhiGraphicsPipeline::ConstantAlpha:
        return GL_CONSTANT_ALPHA;
    case QRhiGraphicsPipeline::OneMinusConstantAlpha:
        return GL_ONE_MINUS_CONSTANT_ALPHA;
    case QRhiGraphicsPipeline::SrcAlphaSaturate:
        return GL_SRC_ALPHA_SATURATE;
    case QRhiGraphicsPipeline::Src1Color:
    case QRhiGraphicsPipeline::OneMinusSrc1Color:
    case QRhiGraphicsPipeline::Src1Alpha:
    case QRhiGraphicsPipeline::OneMinusSrc1Alpha:
        qWarning("Unsupported blend factor %d", f);
        return GL_ZERO;
    default:
        Q_UNREACHABLE_RETURN(GL_ZERO);
    }
}